

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O2

bool __thiscall
moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::Block::
is_empty<(moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
          (Block *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x20) break;
    uVar1 = uVar2 + 1;
  } while ((this->emptyFlags[uVar2]._M_base._M_i & 1U) != 0);
  return 0x1f < uVar2;
}

Assistant:

inline bool is_empty() const
        {
            if (context == explicit_context && BLOCK_SIZE <= EXPLICIT_BLOCK_EMPTY_COUNTER_THRESHOLD) {
                // Check flags
                for (size_t i = 0; i < BLOCK_SIZE; ++i) {
                    if (!emptyFlags[i].load(std::memory_order_relaxed)) {
                        return false;
                    }
                }
                
                // Aha, empty; make sure we have all other memory effects that happened before the empty flags were set
                std::atomic_thread_fence(std::memory_order_acquire);
                return true;
            }
            else {
                // Check counter
                if (elementsCompletelyDequeued.load(std::memory_order_relaxed) == BLOCK_SIZE) {
                    std::atomic_thread_fence(std::memory_order_acquire);
                    return true;
                }
                assert(elementsCompletelyDequeued.load(std::memory_order_relaxed) <= BLOCK_SIZE);
                return false;
            }
        }